

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_extcomplex_str
              (lys_module *module,lys_ext_instance_complex *ext,char *arg_name,char *parent_name,
              char *value,int parent_stmt,LY_STMT stmt)

{
  size_t __size;
  LY_ECODE code;
  lyext_substmt *plVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  undefined1 *puVar5;
  void *pvVar6;
  long lVar7;
  LY_ERR *pLVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  lyext_substmt *local_48;
  lyext_substmt *info;
  long *local_38;
  
  if (parent_stmt == 3 && stmt == LY_STMT_PREFIX) {
    plVar2 = (long *)lys_ext_complex_get_substmt(LY_STMT_BELONGSTO,ext,&local_48);
    if (local_48->cardinality < LY_STMT_CARD_SOME) {
      plVar2 = plVar2 + 1;
      uVar9 = 0;
    }
    else {
      uVar9 = 0xffffffffffffffff;
      do {
        lVar11 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(long *)(*plVar2 + 0x10 + lVar11) != 0);
      plVar2 = (long *)plVar2[1];
      uVar9 = uVar9 & 0xffffffff;
    }
    pcVar3 = lydict_insert_zc(module->ctx,value);
    plVar2[uVar9] = (long)pcVar3;
    return 0;
  }
  plVar2 = (long *)lys_ext_complex_get_substmt(stmt,ext,&local_48);
  if (plVar2 == (long *)0x0) {
    code = LYE_INCHILDSTMT;
LAB_0014d834:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,arg_name,parent_name);
    free(value);
  }
  else {
    plVar4 = (long *)*plVar2;
    info = (lyext_substmt *)module;
    if (local_48->cardinality < LY_STMT_CARD_SOME) {
      if (plVar4 != (long *)0x0) {
        code = LYE_TOOMANY;
        goto LAB_0014d834;
      }
      iVar10 = 0;
      local_38 = (long *)0x0;
      plVar4 = plVar2;
    }
    else {
      local_38 = plVar2;
      if (plVar4 == (long *)0x0) {
        plVar4 = (long *)calloc(2,8);
        plVar2 = local_38;
        *local_38 = (long)plVar4;
        iVar10 = 0;
        if (stmt == LY_STMT_ARGUMENT) {
          puVar5 = (undefined1 *)calloc(2,1);
          plVar2[1] = (long)puVar5;
          *puVar5 = 2;
        }
        else if (stmt == LY_STMT_BELONGSTO) {
          pvVar6 = calloc(2,8);
          plVar2[1] = (long)pvVar6;
        }
      }
      else {
        lVar11 = 0;
        do {
          plVar2 = plVar4 + lVar11;
          lVar11 = lVar11 + 1;
        } while (*plVar2 != 0);
        iVar10 = (int)lVar11 + -1;
      }
    }
    pcVar3 = lydict_insert_zc(*(ly_ctx **)info,value);
    plVar2 = local_38;
    lVar11 = (long)iVar10;
    plVar4[lVar11] = (long)pcVar3;
    if (iVar10 == 0) {
      return 0;
    }
    __size = lVar11 * 8 + 0x10;
    pvVar6 = realloc((void *)*local_38,__size);
    plVar1 = info;
    if (pvVar6 == (void *)0x0) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
      lydict_remove(*(ly_ctx **)info,*(char **)(*plVar2 + lVar11 * 8));
      lVar7 = *plVar2;
    }
    else {
      *plVar2 = (long)pvVar6;
      *(undefined8 *)((long)pvVar6 + lVar11 * 8 + 8) = 0;
      if (stmt == LY_STMT_ARGUMENT) {
        pvVar6 = realloc((void *)plVar2[1],lVar11 + 2);
        if (pvVar6 == (void *)0x0) {
          pLVar8 = ly_errno_location();
          *pLVar8 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
          *(undefined1 *)(plVar2[1] + lVar11) = 0;
          return 1;
        }
        plVar2[1] = (long)pvVar6;
        *(undefined1 *)((long)pvVar6 + lVar11 + 1) = 0;
        return 0;
      }
      if (stmt != LY_STMT_BELONGSTO) {
        return 0;
      }
      pvVar6 = realloc((void *)plVar2[1],__size);
      if (pvVar6 != (void *)0x0) {
        plVar2[1] = (long)pvVar6;
        *(undefined8 *)((long)pvVar6 + lVar11 * 8 + 8) = 0;
        return 0;
      }
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_extcomplex_str");
      lydict_remove(*(ly_ctx **)plVar1,*(char **)(plVar2[1] + lVar11 * 8));
      lVar7 = plVar2[1];
    }
    *(undefined8 *)(lVar7 + lVar11 * 8) = 0;
  }
  return 1;
}

Assistant:

int
yang_read_extcomplex_str(struct lys_module *module, struct lys_ext_instance_complex *ext, const char *arg_name,
                         const char *parent_name, char *value, int parent_stmt, LY_STMT stmt)
{
    int c;
    const char **str, ***p = NULL;
    void *reallocated;
    struct lyext_substmt *info;

    c = 0;
    if (stmt == LY_STMT_PREFIX && parent_stmt == LY_STMT_BELONGSTO) {
        /* str contains no NULL value */
        str = lys_ext_complex_get_substmt(LY_STMT_BELONGSTO, ext, &info);
        if (info->cardinality < LY_STMT_CARD_SOME) {
            str++;
        } else {
           /* get the index in the array to add new item */
            p = (const char ***)str;
            for (c = 0; p[0][c + 1]; c++);
            str = p[1];
        }
        str[c] = lydict_insert_zc(module->ctx, value);
    }  else {
        str = lys_ext_complex_get_substmt(stmt, ext, &info);
        if (!str) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }
        if (info->cardinality < LY_STMT_CARD_SOME && *str) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, arg_name, parent_name);
            free(value);
            return EXIT_FAILURE;
        }

        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, str is actually const char *** */
            p = (const char ***)str;
            if (!p[0]) {
                /* allocate initial array */
                p[0] = calloc(2, sizeof(const char *));
                if (stmt == LY_STMT_BELONGSTO) {
                    /* allocate another array for the belongs-to's prefixes */
                    p[1] = calloc(2, sizeof(const char *));
                } else if (stmt == LY_STMT_ARGUMENT) {
                    /* allocate another array for the yin element */
                    ((uint8_t **)p)[1] = calloc(2, sizeof(uint8_t));
                    /* default value of yin element */
                    ((uint8_t *)p[1])[0] = 2;
                }
            } else {
                /* get the index in the array to add new item */
                for (c = 0; p[0][c]; c++);
            }
            str = p[0];
        }

        str[c] = lydict_insert_zc(module->ctx, value);

        if (c) {
            /* enlarge the array(s) */
            reallocated = realloc(p[0], (c + 2) * sizeof(const char *));
            if (!reallocated) {
                LOGMEM;
                lydict_remove(module->ctx, p[0][c]);
                p[0][c] = NULL;
                return EXIT_FAILURE;
            }
            p[0] = reallocated;
            p[0][c + 1] = NULL;

            if (stmt == LY_STMT_BELONGSTO) {
                /* enlarge the second belongs-to's array with prefixes */
                reallocated = realloc(p[1], (c + 2) * sizeof(const char *));
                if (!reallocated) {
                    LOGMEM;
                    lydict_remove(module->ctx, p[1][c]);
                    p[1][c] = NULL;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                p[1][c + 1] = NULL;
            } else if (stmt == LY_STMT_ARGUMENT) {
                /* enlarge the second argument's array with yin element */
                reallocated = realloc(p[1], (c + 2) * sizeof(uint8_t));
                if (!reallocated) {
                    LOGMEM;
                    ((uint8_t *)p[1])[c] = 0;
                    return EXIT_FAILURE;
                }
                p[1] = reallocated;
                ((uint8_t *)p[1])[c + 1] = 0;
            }
        }
    }

    return EXIT_SUCCESS;
}